

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::_permute_axes<unsigned_char>
          (CImg<unsigned_char> *__return_storage_ptr__,CImg<unsigned_char> *this,char *axes_order,
          uchar *param_2)

{
  uchar uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  uchar *puVar9;
  CImgArgumentException *this_00;
  char *pcVar10;
  char *pcVar11;
  uint local_300;
  uint local_2fc;
  int x_22;
  int y_22;
  int z_22;
  int c_23;
  int x_21;
  int y_21;
  int z_21;
  int c_22;
  int x_20;
  int y_20;
  int z_20;
  int c_21;
  int x_19;
  int y_19;
  int z_19;
  int c_20;
  int x_18;
  int y_18;
  int z_18;
  int c_19;
  int x_17;
  int y_17;
  int z_17;
  int c_18;
  ulongT siz_7;
  uchar *ptrd_3;
  uchar *ptr_a_1;
  uchar *ptr_b_3;
  uchar *ptr_g_5;
  uchar *ptr_r_7;
  ulongT siz_6;
  uchar *ptrd_2;
  uchar *ptr_b_2;
  uchar *ptr_g_4;
  uchar *ptr_r_6;
  ulongT siz_5;
  uchar *ptrd_1;
  uchar *ptr_g_3;
  uchar *ptr_r_5;
  ulongT siz_4;
  uchar *ptrd;
  uchar *ptr_r_4;
  uint local_208;
  int x_16;
  int y_16;
  int z_16;
  int c_17;
  int x_15;
  int y_15;
  int z_15;
  int c_16;
  int x_14;
  int y_14;
  int z_14;
  int c_15;
  int x_13;
  int y_13;
  int z_13;
  int c_14;
  int x_12;
  int y_12;
  int z_12;
  int c_13;
  int x_11;
  int y_11;
  int z_11;
  int c_12;
  int x_10;
  int y_10;
  int z_10;
  int c_11;
  int x_9;
  int y_9;
  int z_9;
  int c_10;
  int x_8;
  int y_8;
  int z_8;
  int c_9;
  uint siz_3;
  uchar *ptr_a;
  uchar *ptr_b_1;
  uchar *ptr_g_2;
  uchar *ptr_r_3;
  uchar *puStack_150;
  uint siz_2;
  uchar *ptr_b;
  uchar *ptr_g_1;
  uchar *ptr_r_2;
  uchar *puStack_130;
  uint siz_1;
  uchar *ptr_g;
  uchar *ptr_r_1;
  uchar *puStack_118;
  uint siz;
  uchar *ptr_r;
  int x_7;
  int y_7;
  int z_7;
  int c_8;
  int x_6;
  int y_6;
  int z_6;
  int c_7;
  int x_5;
  int y_5;
  int z_5;
  int c_6;
  int x_4;
  int y_4;
  int z_4;
  int c_5;
  int x_3;
  int y_3;
  int z_3;
  int c_4;
  int x_2;
  int y_2;
  int z_2;
  int c_3;
  int x_1;
  int y_1;
  int z_1;
  int c_2;
  int x;
  int y;
  int z;
  int c_1;
  ulongT whd;
  ulongT wh;
  uint code;
  int c;
  uint l;
  uchar n_code [4];
  uchar s_code [4];
  uchar *ptrs;
  CImg<unsigned_char> res;
  uchar *param_2_local;
  char *axes_order_local;
  CImg<unsigned_char> *this_local;
  
  res._data = param_2;
  bVar5 = is_empty(this);
  if ((bVar5) || (axes_order == (char *)0x0)) {
    CImg(__return_storage_ptr__,this,false);
    return __return_storage_ptr__;
  }
  CImg((CImg<unsigned_char> *)&ptrs);
  _n_code = this->_data;
  l = 0x3020100;
  memset(&c,0,4);
  for (code = 0; axes_order[code] != '\0'; code = code + 1) {
    cVar6 = cimg::lowercase(axes_order[code]);
    iVar7 = (int)cVar6;
    if ((3 < code) || ((((iVar7 != 0x78 && (iVar7 != 0x79)) && (iVar7 != 0x7a)) && (iVar7 != 99))))
    {
      l = CONCAT31(l._1_3_,4);
      break;
    }
    iVar7 = iVar7 % 4;
    *(char *)((long)&c + (long)iVar7) = *(char *)((long)&c + (long)iVar7) + '\x01';
    n_code[(ulong)code - 4] = (uchar)iVar7;
  }
  if ((((*axes_order != '\0') && ((byte)l < 4)) &&
      (((byte)c < 2 && ((c._1_1_ < 2 && (c._2_1_ < 2)))))) && (c._3_1_ < 2)) {
    uVar8 = (l & 0xff) << 0xc | (l >> 8 & 0xff) << 8 | (l >> 0x10 & 0xff) << 4 | l >> 0x18;
    if (uVar8 == 0x123) {
      operator+(__return_storage_ptr__,this);
      goto LAB_001d3095;
    }
    if (uVar8 == 0x132) {
      assign((CImg<unsigned_char> *)&ptrs,this->_width,this->_height,this->_spectrum,this->_depth);
      for (y = 0; y < (int)this->_spectrum; y = y + 1) {
        for (x = 0; x < (int)this->_depth; x = x + 1) {
          for (c_2 = 0; c_2 < (int)this->_height; c_2 = c_2 + 1) {
            for (z_1 = 0; z_1 < (int)this->_width; z_1 = z_1 + 1) {
              uVar1 = *_n_code;
              _n_code = _n_code + 1;
              puVar9 = operator()((CImg<unsigned_char> *)&ptrs,z_1,c_2,y,x,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_ * (ulong)res._width);
              *puVar9 = uVar1;
            }
          }
        }
      }
    }
    else if (uVar8 == 0x213) {
      assign((CImg<unsigned_char> *)&ptrs,this->_width,this->_depth,this->_height,this->_spectrum);
      for (y_1 = 0; y_1 < (int)this->_spectrum; y_1 = y_1 + 1) {
        for (x_1 = 0; x_1 < (int)this->_depth; x_1 = x_1 + 1) {
          for (c_3 = 0; c_3 < (int)this->_height; c_3 = c_3 + 1) {
            for (z_2 = 0; z_2 < (int)this->_width; z_2 = z_2 + 1) {
              uVar1 = *_n_code;
              _n_code = _n_code + 1;
              puVar9 = operator()((CImg<unsigned_char> *)&ptrs,z_2,x_1,c_3,y_1,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_ * (ulong)res._width);
              *puVar9 = uVar1;
            }
          }
        }
      }
    }
    else if (uVar8 == 0x231) {
      assign((CImg<unsigned_char> *)&ptrs,this->_width,this->_depth,this->_spectrum,this->_height);
      for (y_2 = 0; y_2 < (int)this->_spectrum; y_2 = y_2 + 1) {
        for (x_2 = 0; x_2 < (int)this->_depth; x_2 = x_2 + 1) {
          for (c_4 = 0; c_4 < (int)this->_height; c_4 = c_4 + 1) {
            for (z_3 = 0; z_3 < (int)this->_width; z_3 = z_3 + 1) {
              uVar1 = *_n_code;
              _n_code = _n_code + 1;
              puVar9 = operator()((CImg<unsigned_char> *)&ptrs,z_3,x_2,y_2,c_4,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_ * (ulong)res._width);
              *puVar9 = uVar1;
            }
          }
        }
      }
    }
    else if (uVar8 == 0x312) {
      assign((CImg<unsigned_char> *)&ptrs,this->_width,this->_spectrum,this->_height,this->_depth);
      for (y_3 = 0; y_3 < (int)this->_spectrum; y_3 = y_3 + 1) {
        for (x_3 = 0; x_3 < (int)this->_depth; x_3 = x_3 + 1) {
          for (c_5 = 0; c_5 < (int)this->_height; c_5 = c_5 + 1) {
            for (z_4 = 0; z_4 < (int)this->_width; z_4 = z_4 + 1) {
              uVar1 = *_n_code;
              _n_code = _n_code + 1;
              puVar9 = operator()((CImg<unsigned_char> *)&ptrs,z_4,y_3,c_5,x_3,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_ * (ulong)res._width);
              *puVar9 = uVar1;
            }
          }
        }
      }
    }
    else if (uVar8 == 0x321) {
      assign((CImg<unsigned_char> *)&ptrs,this->_width,this->_spectrum,this->_depth,this->_height);
      for (y_4 = 0; y_4 < (int)this->_spectrum; y_4 = y_4 + 1) {
        for (x_4 = 0; x_4 < (int)this->_depth; x_4 = x_4 + 1) {
          for (c_6 = 0; c_6 < (int)this->_height; c_6 = c_6 + 1) {
            for (z_5 = 0; z_5 < (int)this->_width; z_5 = z_5 + 1) {
              uVar1 = *_n_code;
              _n_code = _n_code + 1;
              puVar9 = operator()((CImg<unsigned_char> *)&ptrs,z_5,y_4,x_4,c_6,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_ * (ulong)res._width);
              *puVar9 = uVar1;
            }
          }
        }
      }
    }
    else if (uVar8 == 0x1023) {
      assign((CImg<unsigned_char> *)&ptrs,this->_height,this->_width,this->_depth,this->_spectrum);
      for (y_5 = 0; y_5 < (int)this->_spectrum; y_5 = y_5 + 1) {
        for (x_5 = 0; x_5 < (int)this->_depth; x_5 = x_5 + 1) {
          for (c_7 = 0; c_7 < (int)this->_height; c_7 = c_7 + 1) {
            for (z_6 = 0; z_6 < (int)this->_width; z_6 = z_6 + 1) {
              uVar1 = *_n_code;
              _n_code = _n_code + 1;
              puVar9 = operator()((CImg<unsigned_char> *)&ptrs,c_7,z_6,x_5,y_5,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_ * (ulong)res._width);
              *puVar9 = uVar1;
            }
          }
        }
      }
    }
    else if (uVar8 == 0x1032) {
      assign((CImg<unsigned_char> *)&ptrs,this->_height,this->_width,this->_spectrum,this->_depth);
      for (y_6 = 0; y_6 < (int)this->_spectrum; y_6 = y_6 + 1) {
        for (x_6 = 0; x_6 < (int)this->_depth; x_6 = x_6 + 1) {
          for (c_8 = 0; c_8 < (int)this->_height; c_8 = c_8 + 1) {
            for (z_7 = 0; z_7 < (int)this->_width; z_7 = z_7 + 1) {
              uVar1 = *_n_code;
              _n_code = _n_code + 1;
              puVar9 = operator()((CImg<unsigned_char> *)&ptrs,c_8,z_7,y_6,x_6,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_ * (ulong)res._width);
              *puVar9 = uVar1;
            }
          }
        }
      }
    }
    else if (uVar8 == 0x1203) {
      assign((CImg<unsigned_char> *)&ptrs,this->_height,this->_depth,this->_width,this->_spectrum);
      for (y_7 = 0; y_7 < (int)this->_spectrum; y_7 = y_7 + 1) {
        for (x_7 = 0; x_7 < (int)this->_depth; x_7 = x_7 + 1) {
          for (ptr_r._4_4_ = 0; (int)ptr_r._4_4_ < (int)this->_height; ptr_r._4_4_ = ptr_r._4_4_ + 1
              ) {
            for (ptr_r._0_4_ = 0; (int)(uint)ptr_r < (int)this->_width;
                ptr_r._0_4_ = (uint)ptr_r + 1) {
              uVar1 = *_n_code;
              _n_code = _n_code + 1;
              puVar9 = operator()((CImg<unsigned_char> *)&ptrs,ptr_r._4_4_,x_7,(uint)ptr_r,y_7,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_ * (ulong)res._width);
              *puVar9 = uVar1;
            }
          }
        }
      }
    }
    else if (uVar8 == 0x1230) {
      assign((CImg<unsigned_char> *)&ptrs,this->_height,this->_depth,this->_spectrum,this->_width);
      switch(this->_width) {
      case 1:
        puStack_118 = data((CImg<unsigned_char> *)&ptrs,0,0,0,0);
        for (ptr_r_1._4_4_ = this->_height * this->_depth * this->_spectrum; ptr_r_1._4_4_ != 0;
            ptr_r_1._4_4_ = ptr_r_1._4_4_ + -1) {
          *puStack_118 = *_n_code;
          puStack_118 = puStack_118 + 1;
          _n_code = _n_code + 1;
        }
        break;
      case 2:
        ptr_g = data((CImg<unsigned_char> *)&ptrs,0,0,0,0);
        puStack_130 = data((CImg<unsigned_char> *)&ptrs,0,0,0,1);
        for (ptr_r_2._4_4_ = this->_height * this->_depth * this->_spectrum; ptr_r_2._4_4_ != 0;
            ptr_r_2._4_4_ = ptr_r_2._4_4_ + -1) {
          *ptr_g = *_n_code;
          *puStack_130 = _n_code[1];
          _n_code = _n_code + 2;
          puStack_130 = puStack_130 + 1;
          ptr_g = ptr_g + 1;
        }
        break;
      case 3:
        ptr_g_1 = data((CImg<unsigned_char> *)&ptrs,0,0,0,0);
        ptr_b = data((CImg<unsigned_char> *)&ptrs,0,0,0,1);
        puStack_150 = data((CImg<unsigned_char> *)&ptrs,0,0,0,2);
        for (ptr_r_3._4_4_ = this->_height * this->_depth * this->_spectrum; ptr_r_3._4_4_ != 0;
            ptr_r_3._4_4_ = ptr_r_3._4_4_ + -1) {
          *ptr_g_1 = *_n_code;
          *ptr_b = _n_code[1];
          *puStack_150 = _n_code[2];
          _n_code = _n_code + 3;
          puStack_150 = puStack_150 + 1;
          ptr_b = ptr_b + 1;
          ptr_g_1 = ptr_g_1 + 1;
        }
        break;
      case 4:
        ptr_g_2 = data((CImg<unsigned_char> *)&ptrs,0,0,0,0);
        ptr_b_1 = data((CImg<unsigned_char> *)&ptrs,0,0,0,1);
        ptr_a = data((CImg<unsigned_char> *)&ptrs,0,0,0,2);
        _c_9 = data((CImg<unsigned_char> *)&ptrs,0,0,0,3);
        for (z_8 = this->_height * this->_depth * this->_spectrum; z_8 != 0; z_8 = z_8 + -1) {
          *ptr_g_2 = *_n_code;
          *ptr_b_1 = _n_code[1];
          *ptr_a = _n_code[2];
          *_c_9 = _n_code[3];
          _n_code = _n_code + 4;
          _c_9 = _c_9 + 1;
          ptr_a = ptr_a + 1;
          ptr_b_1 = ptr_b_1 + 1;
          ptr_g_2 = ptr_g_2 + 1;
        }
        break;
      default:
        for (y_8 = 0; y_8 < (int)this->_spectrum; y_8 = y_8 + 1) {
          for (x_8 = 0; x_8 < (int)this->_depth; x_8 = x_8 + 1) {
            for (c_10 = 0; c_10 < (int)this->_height; c_10 = c_10 + 1) {
              for (z_9 = 0; z_9 < (int)this->_width; z_9 = z_9 + 1) {
                uVar1 = *_n_code;
                _n_code = _n_code + 1;
                puVar9 = operator()((CImg<unsigned_char> *)&ptrs,c_10,x_8,y_8,z_9,
                                    (ulong)(uint)ptrs * (ulong)ptrs._4_4_,
                                    (ulong)(uint)ptrs * (ulong)ptrs._4_4_ * (ulong)res._width);
                *puVar9 = uVar1;
              }
            }
          }
        }
        CImg(__return_storage_ptr__,(CImg<unsigned_char> *)&ptrs);
        goto LAB_001d3095;
      }
    }
    else if (uVar8 == 0x1302) {
      assign((CImg<unsigned_char> *)&ptrs,this->_height,this->_spectrum,this->_width,this->_depth);
      for (y_9 = 0; y_9 < (int)this->_spectrum; y_9 = y_9 + 1) {
        for (x_9 = 0; x_9 < (int)this->_depth; x_9 = x_9 + 1) {
          for (c_11 = 0; c_11 < (int)this->_height; c_11 = c_11 + 1) {
            for (z_10 = 0; z_10 < (int)this->_width; z_10 = z_10 + 1) {
              uVar1 = *_n_code;
              _n_code = _n_code + 1;
              puVar9 = operator()((CImg<unsigned_char> *)&ptrs,c_11,y_9,z_10,x_9,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_ * (ulong)res._width);
              *puVar9 = uVar1;
            }
          }
        }
      }
    }
    else if (uVar8 == 0x1320) {
      assign((CImg<unsigned_char> *)&ptrs,this->_height,this->_spectrum,this->_depth,this->_width);
      for (y_10 = 0; y_10 < (int)this->_spectrum; y_10 = y_10 + 1) {
        for (x_10 = 0; x_10 < (int)this->_depth; x_10 = x_10 + 1) {
          for (c_12 = 0; c_12 < (int)this->_height; c_12 = c_12 + 1) {
            for (z_11 = 0; z_11 < (int)this->_width; z_11 = z_11 + 1) {
              uVar1 = *_n_code;
              _n_code = _n_code + 1;
              puVar9 = operator()((CImg<unsigned_char> *)&ptrs,c_12,y_10,x_10,z_11,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_ * (ulong)res._width);
              *puVar9 = uVar1;
            }
          }
        }
      }
    }
    else if (uVar8 == 0x2013) {
      assign((CImg<unsigned_char> *)&ptrs,this->_depth,this->_width,this->_height,this->_spectrum);
      for (y_11 = 0; y_11 < (int)this->_spectrum; y_11 = y_11 + 1) {
        for (x_11 = 0; x_11 < (int)this->_depth; x_11 = x_11 + 1) {
          for (c_13 = 0; c_13 < (int)this->_height; c_13 = c_13 + 1) {
            for (z_12 = 0; z_12 < (int)this->_width; z_12 = z_12 + 1) {
              uVar1 = *_n_code;
              _n_code = _n_code + 1;
              puVar9 = operator()((CImg<unsigned_char> *)&ptrs,x_11,z_12,c_13,y_11,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_ * (ulong)res._width);
              *puVar9 = uVar1;
            }
          }
        }
      }
    }
    else if (uVar8 == 0x2031) {
      assign((CImg<unsigned_char> *)&ptrs,this->_depth,this->_width,this->_spectrum,this->_height);
      for (y_12 = 0; y_12 < (int)this->_spectrum; y_12 = y_12 + 1) {
        for (x_12 = 0; x_12 < (int)this->_depth; x_12 = x_12 + 1) {
          for (c_14 = 0; c_14 < (int)this->_height; c_14 = c_14 + 1) {
            for (z_13 = 0; z_13 < (int)this->_width; z_13 = z_13 + 1) {
              uVar1 = *_n_code;
              _n_code = _n_code + 1;
              puVar9 = operator()((CImg<unsigned_char> *)&ptrs,x_12,z_13,y_12,c_14,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_ * (ulong)res._width);
              *puVar9 = uVar1;
            }
          }
        }
      }
    }
    else if (uVar8 == 0x2103) {
      assign((CImg<unsigned_char> *)&ptrs,this->_depth,this->_height,this->_width,this->_spectrum);
      for (y_13 = 0; y_13 < (int)this->_spectrum; y_13 = y_13 + 1) {
        for (x_13 = 0; x_13 < (int)this->_depth; x_13 = x_13 + 1) {
          for (c_15 = 0; c_15 < (int)this->_height; c_15 = c_15 + 1) {
            for (z_14 = 0; z_14 < (int)this->_width; z_14 = z_14 + 1) {
              uVar1 = *_n_code;
              _n_code = _n_code + 1;
              puVar9 = operator()((CImg<unsigned_char> *)&ptrs,x_13,c_15,z_14,y_13,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_ * (ulong)res._width);
              *puVar9 = uVar1;
            }
          }
        }
      }
    }
    else if (uVar8 == 0x2130) {
      assign((CImg<unsigned_char> *)&ptrs,this->_depth,this->_height,this->_spectrum,this->_width);
      for (y_14 = 0; y_14 < (int)this->_spectrum; y_14 = y_14 + 1) {
        for (x_14 = 0; x_14 < (int)this->_depth; x_14 = x_14 + 1) {
          for (c_16 = 0; c_16 < (int)this->_height; c_16 = c_16 + 1) {
            for (z_15 = 0; z_15 < (int)this->_width; z_15 = z_15 + 1) {
              uVar1 = *_n_code;
              _n_code = _n_code + 1;
              puVar9 = operator()((CImg<unsigned_char> *)&ptrs,x_14,c_16,y_14,z_15,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_ * (ulong)res._width);
              *puVar9 = uVar1;
            }
          }
        }
      }
    }
    else if (uVar8 == 0x2301) {
      assign((CImg<unsigned_char> *)&ptrs,this->_depth,this->_spectrum,this->_width,this->_height);
      for (y_15 = 0; y_15 < (int)this->_spectrum; y_15 = y_15 + 1) {
        for (x_15 = 0; x_15 < (int)this->_depth; x_15 = x_15 + 1) {
          for (c_17 = 0; c_17 < (int)this->_height; c_17 = c_17 + 1) {
            for (z_16 = 0; z_16 < (int)this->_width; z_16 = z_16 + 1) {
              uVar1 = *_n_code;
              _n_code = _n_code + 1;
              puVar9 = operator()((CImg<unsigned_char> *)&ptrs,x_15,y_15,z_16,c_17,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_ * (ulong)res._width);
              *puVar9 = uVar1;
            }
          }
        }
      }
    }
    else if (uVar8 == 0x2310) {
      assign((CImg<unsigned_char> *)&ptrs,this->_depth,this->_spectrum,this->_height,this->_width);
      for (y_16 = 0; y_16 < (int)this->_spectrum; y_16 = y_16 + 1) {
        for (x_16 = 0; x_16 < (int)this->_depth; x_16 = x_16 + 1) {
          for (local_208 = 0; (int)local_208 < (int)this->_height; local_208 = local_208 + 1) {
            for (ptr_r_4._4_4_ = 0; (int)ptr_r_4._4_4_ < (int)this->_width;
                ptr_r_4._4_4_ = ptr_r_4._4_4_ + 1) {
              uVar1 = *_n_code;
              _n_code = _n_code + 1;
              puVar9 = operator()((CImg<unsigned_char> *)&ptrs,x_16,y_16,local_208,ptr_r_4._4_4_,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_ * (ulong)res._width);
              *puVar9 = uVar1;
            }
          }
        }
      }
    }
    else if (uVar8 == 0x3012) {
      assign((CImg<unsigned_char> *)&ptrs,this->_spectrum,this->_width,this->_height,this->_depth);
      switch(this->_spectrum) {
      case 1:
        ptrd = data(this,0,0,0,0);
        siz_4 = res._16_8_;
        for (ptr_r_5 = (uchar *)((ulong)this->_width * (ulong)this->_height * (ulong)this->_depth);
            ptr_r_5 != (uchar *)0x0; ptr_r_5 = ptr_r_5 + -1) {
          *(uchar *)siz_4 = *ptrd;
          siz_4 = siz_4 + 1;
          ptrd = ptrd + 1;
        }
        break;
      case 2:
        ptr_g_3 = data(this,0,0,0,0);
        ptrd_1 = data(this,0,0,0,1);
        siz_5 = res._16_8_;
        for (ptr_r_6 = (uchar *)((ulong)this->_width * (ulong)this->_height * (ulong)this->_depth);
            ptr_r_6 != (uchar *)0x0; ptr_r_6 = ptr_r_6 + -1) {
          *(uchar *)siz_5 = *ptr_g_3;
          *(uchar *)(siz_5 + 1) = *ptrd_1;
          siz_5 = siz_5 + 2;
          ptrd_1 = ptrd_1 + 1;
          ptr_g_3 = ptr_g_3 + 1;
        }
        break;
      case 3:
        ptr_g_4 = data(this,0,0,0,0);
        ptr_b_2 = data(this,0,0,0,1);
        ptrd_2 = data(this,0,0,0,2);
        siz_6 = res._16_8_;
        for (ptr_r_7 = (uchar *)((ulong)this->_width * (ulong)this->_height * (ulong)this->_depth);
            ptr_r_7 != (uchar *)0x0; ptr_r_7 = ptr_r_7 + -1) {
          *(uchar *)siz_6 = *ptr_g_4;
          *(uchar *)(siz_6 + 1) = *ptr_b_2;
          *(uchar *)(siz_6 + 2) = *ptrd_2;
          siz_6 = siz_6 + 3;
          ptrd_2 = ptrd_2 + 1;
          ptr_b_2 = ptr_b_2 + 1;
          ptr_g_4 = ptr_g_4 + 1;
        }
        break;
      case 4:
        ptr_g_5 = data(this,0,0,0,0);
        ptr_b_3 = data(this,0,0,0,1);
        ptr_a_1 = data(this,0,0,0,2);
        ptrd_3 = data(this,0,0,0,3);
        siz_7 = res._16_8_;
        for (_z_17 = (ulong)this->_width * (ulong)this->_height * (ulong)this->_depth; _z_17 != 0;
            _z_17 = _z_17 + -1) {
          *(uchar *)siz_7 = *ptr_g_5;
          *(uchar *)(siz_7 + 1) = *ptr_b_3;
          *(uchar *)(siz_7 + 2) = *ptr_a_1;
          *(uchar *)(siz_7 + 3) = *ptrd_3;
          siz_7 = siz_7 + 4;
          ptrd_3 = ptrd_3 + 1;
          ptr_a_1 = ptr_a_1 + 1;
          ptr_b_3 = ptr_b_3 + 1;
          ptr_g_5 = ptr_g_5 + 1;
        }
        break;
      default:
        for (y_17 = 0; y_17 < (int)this->_spectrum; y_17 = y_17 + 1) {
          for (x_17 = 0; x_17 < (int)this->_depth; x_17 = x_17 + 1) {
            for (c_19 = 0; c_19 < (int)this->_height; c_19 = c_19 + 1) {
              for (z_18 = 0; z_18 < (int)this->_width; z_18 = z_18 + 1) {
                uVar1 = *_n_code;
                _n_code = _n_code + 1;
                puVar9 = operator()((CImg<unsigned_char> *)&ptrs,y_17,z_18,c_19,x_17,
                                    (ulong)(uint)ptrs * (ulong)ptrs._4_4_,
                                    (ulong)(uint)ptrs * (ulong)ptrs._4_4_ * (ulong)res._width);
                *puVar9 = uVar1;
              }
            }
          }
        }
      }
    }
    else if (uVar8 == 0x3021) {
      assign((CImg<unsigned_char> *)&ptrs,this->_spectrum,this->_width,this->_depth,this->_height);
      for (y_18 = 0; y_18 < (int)this->_spectrum; y_18 = y_18 + 1) {
        for (x_18 = 0; x_18 < (int)this->_depth; x_18 = x_18 + 1) {
          for (c_20 = 0; c_20 < (int)this->_height; c_20 = c_20 + 1) {
            for (z_19 = 0; z_19 < (int)this->_width; z_19 = z_19 + 1) {
              uVar1 = *_n_code;
              _n_code = _n_code + 1;
              puVar9 = operator()((CImg<unsigned_char> *)&ptrs,y_18,z_19,x_18,c_20,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_ * (ulong)res._width);
              *puVar9 = uVar1;
            }
          }
        }
      }
    }
    else if (uVar8 == 0x3102) {
      assign((CImg<unsigned_char> *)&ptrs,this->_spectrum,this->_height,this->_width,this->_depth);
      for (y_19 = 0; y_19 < (int)this->_spectrum; y_19 = y_19 + 1) {
        for (x_19 = 0; x_19 < (int)this->_depth; x_19 = x_19 + 1) {
          for (c_21 = 0; c_21 < (int)this->_height; c_21 = c_21 + 1) {
            for (z_20 = 0; z_20 < (int)this->_width; z_20 = z_20 + 1) {
              uVar1 = *_n_code;
              _n_code = _n_code + 1;
              puVar9 = operator()((CImg<unsigned_char> *)&ptrs,y_19,c_21,z_20,x_19,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_ * (ulong)res._width);
              *puVar9 = uVar1;
            }
          }
        }
      }
    }
    else if (uVar8 == 0x3120) {
      assign((CImg<unsigned_char> *)&ptrs,this->_spectrum,this->_height,this->_depth,this->_width);
      for (y_20 = 0; y_20 < (int)this->_spectrum; y_20 = y_20 + 1) {
        for (x_20 = 0; x_20 < (int)this->_depth; x_20 = x_20 + 1) {
          for (c_22 = 0; c_22 < (int)this->_height; c_22 = c_22 + 1) {
            for (z_21 = 0; z_21 < (int)this->_width; z_21 = z_21 + 1) {
              uVar1 = *_n_code;
              _n_code = _n_code + 1;
              puVar9 = operator()((CImg<unsigned_char> *)&ptrs,y_20,c_22,x_20,z_21,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_ * (ulong)res._width);
              *puVar9 = uVar1;
            }
          }
        }
      }
    }
    else if (uVar8 == 0x3201) {
      assign((CImg<unsigned_char> *)&ptrs,this->_spectrum,this->_depth,this->_width,this->_height);
      for (y_21 = 0; y_21 < (int)this->_spectrum; y_21 = y_21 + 1) {
        for (x_21 = 0; x_21 < (int)this->_depth; x_21 = x_21 + 1) {
          for (c_23 = 0; c_23 < (int)this->_height; c_23 = c_23 + 1) {
            for (z_22 = 0; z_22 < (int)this->_width; z_22 = z_22 + 1) {
              uVar1 = *_n_code;
              _n_code = _n_code + 1;
              puVar9 = operator()((CImg<unsigned_char> *)&ptrs,y_21,x_21,z_22,c_23,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_ * (ulong)res._width);
              *puVar9 = uVar1;
            }
          }
        }
      }
    }
    else if (uVar8 == 0x3210) {
      assign((CImg<unsigned_char> *)&ptrs,this->_spectrum,this->_depth,this->_height,this->_width);
      for (y_22 = 0; y_22 < (int)this->_spectrum; y_22 = y_22 + 1) {
        for (x_22 = 0; x_22 < (int)this->_depth; x_22 = x_22 + 1) {
          for (local_2fc = 0; (int)local_2fc < (int)this->_height; local_2fc = local_2fc + 1) {
            for (local_300 = 0; (int)local_300 < (int)this->_width; local_300 = local_300 + 1) {
              uVar1 = *_n_code;
              _n_code = _n_code + 1;
              puVar9 = operator()((CImg<unsigned_char> *)&ptrs,y_22,x_22,local_2fc,local_300,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_ * (ulong)res._width);
              *puVar9 = uVar1;
            }
          }
        }
      }
    }
  }
  puVar9 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&ptrs);
  if (puVar9 == (uchar *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    uVar8 = this->_width;
    uVar2 = this->_height;
    uVar3 = this->_depth;
    uVar4 = this->_spectrum;
    puVar9 = this->_data;
    pcVar10 = "non-";
    if ((this->_is_shared & 1U) != 0) {
      pcVar10 = "";
    }
    pcVar11 = pixel_type();
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::permute_axes(): Invalid specified axes order \'%s\'."
               ,(ulong)uVar8,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar9,pcVar10,pcVar11,
               axes_order);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,
                CImgArgumentException::~CImgArgumentException);
  }
  CImg(__return_storage_ptr__,(CImg<unsigned_char> *)&ptrs);
LAB_001d3095:
  ~CImg((CImg<unsigned_char> *)&ptrs);
  return __return_storage_ptr__;
}

Assistant:

CImg<t> _permute_axes(const char *const axes_order, const t&) const {
      if (is_empty() || !axes_order) return CImg<t>(*this,false);
      CImg<t> res;
      const T* ptrs = _data;
      unsigned char s_code[4] = { 0,1,2,3 }, n_code[4] = { 0 };
      for (unsigned int l = 0; axes_order[l]; ++l) {
        int c = cimg::lowercase(axes_order[l]);
        if (l>=4 || (c!='x' && c!='y' && c!='z' && c!='c')) { *s_code = 4; break; }
        else { ++n_code[c%=4]; s_code[l] = c; }
      }
      if (*axes_order && *s_code<4 && *n_code<=1 && n_code[1]<=1 && n_code[2]<=1 && n_code[3]<=1) {
        const unsigned int code = (s_code[0]<<12) | (s_code[1]<<8) | (s_code[2]<<4) | (s_code[3]);
        ulongT wh, whd;
        switch (code) {
        case 0x0123 : // xyzc
          return +*this;
        case 0x0132 : // xycz
          res.assign(_width,_height,_spectrum,_depth);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(x,y,c,z,wh,whd) = (t)*(ptrs++);
          break;
        case 0x0213 : // xzyc
          res.assign(_width,_depth,_height,_spectrum);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(x,z,y,c,wh,whd) = (t)*(ptrs++);
          break;
        case 0x0231 : // xzcy
          res.assign(_width,_depth,_spectrum,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(x,z,c,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x0312 : // xcyz
          res.assign(_width,_spectrum,_height,_depth);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(x,c,y,z,wh,whd) = (t)*(ptrs++);
          break;
        case 0x0321 : // xczy
          res.assign(_width,_spectrum,_depth,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(x,c,z,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x1023 : // yxzc
          res.assign(_height,_width,_depth,_spectrum);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,x,z,c,wh,whd) = (t)*(ptrs++);
          break;
        case 0x1032 : // yxcz
          res.assign(_height,_width,_spectrum,_depth);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,x,c,z,wh,whd) = (t)*(ptrs++);
          break;
        case 0x1203 : // yzxc
          res.assign(_height,_depth,_width,_spectrum);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,z,x,c,wh,whd) = (t)*(ptrs++);
          break;
        case 0x1230 : // yzcx
          res.assign(_height,_depth,_spectrum,_width);
          switch (_width) {
          case 1 : {
            t *ptr_r = res.data(0,0,0,0);
            for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
              *(ptr_r++) = (t)*(ptrs++);
            }
          } break;
          case 2 : {
            t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1);
            for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
              *(ptr_r++) = (t)ptrs[0];
              *(ptr_g++) = (t)ptrs[1];
              ptrs+=2;
            }
          } break;
          case 3 : { // Optimization for the classical conversion from interleaved RGB to planar RGB
            t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1), *ptr_b = res.data(0,0,0,2);
            for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
              *(ptr_r++) = (t)ptrs[0];
              *(ptr_g++) = (t)ptrs[1];
              *(ptr_b++) = (t)ptrs[2];
              ptrs+=3;
            }
          } break;
          case 4 : { // Optimization for the classical conversion from interleaved RGBA to planar RGBA
            t
              *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1),
              *ptr_b = res.data(0,0,0,2), *ptr_a = res.data(0,0,0,3);
            for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
              *(ptr_r++) = (t)ptrs[0];
              *(ptr_g++) = (t)ptrs[1];
              *(ptr_b++) = (t)ptrs[2];
              *(ptr_a++) = (t)ptrs[3];
              ptrs+=4;
            }
          } break;
          default : {
            wh = (ulongT)res._width*res._height; whd = wh*res._depth;
            cimg_forXYZC(*this,x,y,z,c) res(y,z,c,x,wh,whd) = *(ptrs++);
            return res;
          }
          }
          break;
        case 0x1302 : // ycxz
          res.assign(_height,_spectrum,_width,_depth);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,c,x,z,wh,whd) = (t)*(ptrs++);
          break;
        case 0x1320 : // yczx
          res.assign(_height,_spectrum,_depth,_width);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,c,z,x,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2013 : // zxyc
          res.assign(_depth,_width,_height,_spectrum);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,x,y,c,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2031 : // zxcy
          res.assign(_depth,_width,_spectrum,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,x,c,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2103 : // zyxc
          res.assign(_depth,_height,_width,_spectrum);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,y,x,c,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2130 : // zycx
          res.assign(_depth,_height,_spectrum,_width);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,y,c,x,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2301 : // zcxy
          res.assign(_depth,_spectrum,_width,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,c,x,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x2310 : // zcyx
          res.assign(_depth,_spectrum,_height,_width);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(z,c,y,x,wh,whd) = (t)*(ptrs++);
          break;
        case 0x3012 : // cxyz
          res.assign(_spectrum,_width,_height,_depth);
          switch (_spectrum) {
          case 1 : {
            const T *ptr_r = data(0,0,0,0);
            t *ptrd = res._data;
            for (ulongT siz = (ulongT)_width*_height*_depth; siz; --siz) *(ptrd++) = (t)*(ptr_r++);
          } break;
          case 2 : {
            const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1);
            t *ptrd = res._data;
            for (ulongT siz = (ulongT)_width*_height*_depth; siz; --siz) {
              ptrd[0] = (t)*(ptr_r++);
              ptrd[1] = (t)*(ptr_g++);
              ptrd+=2;
            }
          } break;
          case 3 : { // Optimization for the classical conversion from planar RGB to interleaved RGB
            const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2);
            t *ptrd = res._data;
            for (ulongT siz = (ulongT)_width*_height*_depth; siz; --siz) {
              ptrd[0] = (t)*(ptr_r++);
              ptrd[1] = (t)*(ptr_g++);
              ptrd[2] = (t)*(ptr_b++);
              ptrd+=3;
            }
          } break;
          case 4 : { // Optimization for the classical conversion from planar RGBA to interleaved RGBA
            const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2), *ptr_a = data(0,0,0,3);
            t *ptrd = res._data;
            for (ulongT siz = (ulongT)_width*_height*_depth; siz; --siz) {
              ptrd[0] = (t)*(ptr_r++);
              ptrd[1] = (t)*(ptr_g++);
              ptrd[2] = (t)*(ptr_b++);
              ptrd[3] = (t)*(ptr_a++);
              ptrd+=4;
            }
          } break;
          default : {
            wh = (ulongT)res._width*res._height; whd = wh*res._depth;
            cimg_forXYZC(*this,x,y,z,c) res(c,x,y,z,wh,whd) = (t)*(ptrs++);
          }
          }
          break;
        case 0x3021 : // cxzy
          res.assign(_spectrum,_width,_depth,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,x,z,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x3102 : // cyxz
          res.assign(_spectrum,_height,_width,_depth);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,y,x,z,wh,whd) = (t)*(ptrs++);
          break;
        case 0x3120 : // cyzx
          res.assign(_spectrum,_height,_depth,_width);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,y,z,x,wh,whd) = (t)*(ptrs++);
          break;
        case 0x3201 : // czxy
          res.assign(_spectrum,_depth,_width,_height);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,z,x,y,wh,whd) = (t)*(ptrs++);
          break;
        case 0x3210 : // czyx
          res.assign(_spectrum,_depth,_height,_width);
          wh = (ulongT)res._width*res._height; whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,z,y,x,wh,whd) = (t)*(ptrs++);
          break;
        }
      }
      if (!res)
        throw CImgArgumentException(_cimg_instance
                                    "permute_axes(): Invalid specified axes order '%s'.",
                                    cimg_instance,
                                    axes_order);
      return res;
    }